

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-x11.c
# Opt level: O2

errr Term_curs_x11(wchar_t x,wchar_t y)

{
  int iVar1;
  int iVar2;
  
  iVar1 = *(int *)((long)Term->data + 0xe8);
  iVar2 = *(int *)((long)Term->data + 0xf0);
  XDrawRectangle(metadpy_default_0,Infowin->win,xor->gc,(int)Infowin->ox + x * iVar1,
                 (int)Infowin->oy + y * iVar2,iVar1 + -1,iVar2 + -1);
  return 0;
}

Assistant:

static errr Term_curs_x11(int x, int y)
{
	term_data *td = (term_data*)(Term->data);

	XDrawRectangle(Metadpy->dpy, Infowin->win, xor->gc,
				   x * td->tile_wid + Infowin->ox,
				   y * td->tile_hgt + Infowin->oy,
				   td->tile_wid - 1, td->tile_hgt - 1);

	/* Success */
	return (0);
}